

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool close_connection,bool *connection_closed,
          function<void_(httplib::Request_&)> *setup_request)

{
  array<char,_2048UL> *this_00;
  size_t *this_01;
  bool bVar1;
  int iVar2;
  pointer fixed_buffer;
  FILE *__stream;
  ulong uVar3;
  size_t sVar4;
  char *s;
  size_t *__n;
  Stream *__lineptr;
  bool local_d96;
  exception *e;
  char *pcStack_d18;
  bool routed;
  int local_d0c;
  undefined1 local_d08 [4];
  int status;
  string local_ce8;
  string *local_cc8;
  string *range_header_value;
  byte local_c99;
  string local_c98;
  string local_c78;
  undefined1 local_c58 [8];
  Headers dummy_1;
  Headers dummy;
  _Self local_bf0;
  _Self local_be8;
  reference local_be0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header;
  iterator __end1;
  iterator __begin1;
  Headers *__range1;
  Response res;
  Request req;
  undefined1 local_878 [8];
  stream_line_reader line_reader;
  array<char,_2048UL> buf;
  function<void_(httplib::Request_&)> *setup_request_local;
  bool *connection_closed_local;
  bool close_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  this_00 = (array<char,_2048UL> *)(&line_reader.glowable_buffer_.field_2._M_allocated_capacity + 1)
  ;
  memset(this_00,0,0x800);
  fixed_buffer = std::array<char,_2048UL>::data(this_00);
  __stream = (FILE *)std::array<char,_2048UL>::size(this_00);
  __lineptr = strm;
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm,fixed_buffer,(size_t)__stream);
  uVar3 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_878,(char **)__lineptr,__n,__stream);
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = 0;
    req.authorization_count_._0_4_ = 1;
    goto LAB_0019a617;
  }
  Request::Request((Request *)&res.is_chunked_content_provider_);
  Response::Response((Response *)&__range1);
  std::__cxx11::string::operator=((string *)&__range1,"HTTP/1.1");
  __end1 = std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->default_headers_);
  header = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->default_headers_);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&header), bVar1) {
    local_be0 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator*(&__end1);
    local_be8._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&res.reason.field_2 + 8),&local_be0->first);
    local_bf0._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&res.reason.field_2 + 8));
    bVar1 = std::operator==(&local_be8,&local_bf0);
    if (bVar1) {
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::insert((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&res.reason.field_2 + 8),local_be0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  iVar2 = (*strm->_vptr_Stream[7])();
  if (iVar2 < 0x400) {
    sVar4 = detail::stream_line_reader::size((stream_line_reader *)local_878);
    if (sVar4 < 0x2001) {
      s = detail::stream_line_reader::ptr((stream_line_reader *)local_878);
      bVar1 = parse_request_line(this,s,(Request *)&res.is_chunked_content_provider_);
      if ((bVar1) &&
         (bVar1 = detail::read_headers(strm,(Headers *)((long)&req.path.field_2 + 8)), bVar1)) {
        Request::get_header_value_abi_cxx11_
                  (&local_c78,(Request *)&res.is_chunked_content_provider_,"Connection",0);
        bVar1 = std::operator==(&local_c78,"close");
        std::__cxx11::string::~string((string *)&local_c78);
        if (bVar1) {
          *connection_closed = true;
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&req.remote_port,"HTTP/1.0");
        local_c99 = 0;
        local_d96 = false;
        if (bVar1) {
          Request::get_header_value_abi_cxx11_
                    (&local_c98,(Request *)&res.is_chunked_content_provider_,"Connection",0);
          local_c99 = 1;
          local_d96 = std::operator!=(&local_c98,"Keep-Alive");
        }
        if ((local_c99 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_c98);
        }
        if (local_d96 != false) {
          *connection_closed = true;
        }
        (*strm->_vptr_Stream[6])
                  (strm,(undefined1 *)((long)&req.body.field_2 + 8),
                   (undefined1 *)((long)&req.remote_addr.field_2 + 8));
        Request::set_header((Request *)&res.is_chunked_content_provider_,"REMOTE_ADDR",
                            (string *)((long)&req.body.field_2 + 8));
        std::__cxx11::to_string((string *)&range_header_value,req.remote_addr.field_2._8_4_);
        Request::set_header((Request *)&res.is_chunked_content_provider_,"REMOTE_PORT",
                            (string *)&range_header_value);
        std::__cxx11::string::~string((string *)&range_header_value);
        bVar1 = Request::has_header((Request *)&res.is_chunked_content_provider_,"Range");
        if (bVar1) {
          Request::get_header_value_abi_cxx11_
                    (&local_ce8,(Request *)&res.is_chunked_content_provider_,"Range",0);
          local_cc8 = &local_ce8;
          bVar1 = detail::parse_range_header
                            (local_cc8,
                             (Ranges *)&req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (!bVar1) {
            res.version.field_2._8_4_ = 0x1a0;
            this_local._7_1_ =
                 write_response(this,strm,close_connection,
                                (Request *)&res.is_chunked_content_provider_,(Response *)&__range1);
          }
          req.authorization_count_._1_3_ = 0;
          req.authorization_count_._0_1_ = !bVar1;
          std::__cxx11::string::~string((string *)&local_ce8);
          if ((uint)req.authorization_count_ != 0) goto LAB_0019a5e3;
        }
        bVar1 = std::function::operator_cast_to_bool((function *)setup_request);
        if (bVar1) {
          std::function<void_(httplib::Request_&)>::operator()
                    (setup_request,(Request *)&res.is_chunked_content_provider_);
        }
        Request::get_header_value_abi_cxx11_
                  ((string *)local_d08,(Request *)&res.is_chunked_content_provider_,"Expect",0);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d08,"100-continue");
        std::__cxx11::string::~string((string *)local_d08);
        if (bVar1) {
          local_d0c = 100;
          bVar1 = std::function::operator_cast_to_bool
                            ((function *)&this->expect_100_continue_handler_);
          if (bVar1) {
            local_d0c = std::function<int_(const_httplib::Request_&,_httplib::Response_&)>::
                        operator()(&this->expect_100_continue_handler_,
                                   (Request *)&res.is_chunked_content_provider_,
                                   (Response *)&__range1);
          }
          if ((local_d0c != 100) && (local_d0c != 0x1a1)) {
            this_local._7_1_ =
                 write_response(this,strm,close_connection,
                                (Request *)&res.is_chunked_content_provider_,(Response *)&__range1);
            req.authorization_count_._0_4_ = 1;
            goto LAB_0019a5e3;
          }
          pcStack_d18 = detail::status_message(local_d0c);
          Stream::write_format<int,char_const*>
                    (strm,"HTTP/1.1 %d %s\r\n\r\n",&local_d0c,&stack0xfffffffffffff2e8);
        }
        bVar1 = routing(this,(Request *)&res.is_chunked_content_provider_,(Response *)&__range1,strm
                       );
        if (bVar1) {
          if (res.version.field_2._8_4_ == -1) {
            bVar1 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::
                    empty((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                          &req.files._M_t._M_impl.super__Rb_tree_header._M_node_count);
            res.version.field_2._8_4_ = 0xce;
            if (bVar1) {
              res.version.field_2._8_4_ = 200;
            }
          }
          this_local._7_1_ =
               write_response_with_content
                         (this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                          (Response *)&__range1);
          req.authorization_count_._0_4_ = 1;
        }
        else {
          if (res.version.field_2._8_4_ == -1) {
            res.version.field_2._8_4_ = 0x194;
          }
          this_local._7_1_ =
               write_response(this,strm,close_connection,
                              (Request *)&res.is_chunked_content_provider_,(Response *)&__range1);
          req.authorization_count_._0_4_ = 1;
        }
      }
      else {
        res.version.field_2._8_4_ = 400;
        this_local._7_1_ =
             write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                            (Response *)&__range1);
        req.authorization_count_._0_4_ = 1;
      }
    }
    else {
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c58);
      detail::read_headers
                (strm,(multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_c58);
      res.version.field_2._8_4_ = 0x19e;
      this_local._7_1_ =
           write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                          (Response *)&__range1);
      req.authorization_count_._0_4_ = 1;
      std::
      multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c58);
    }
  }
  else {
    this_01 = &dummy_1._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)this_01);
    detail::read_headers(strm,(Headers *)this_01);
    res.version.field_2._8_4_ = 500;
    this_local._7_1_ =
         write_response(this,strm,close_connection,(Request *)&res.is_chunked_content_provider_,
                        (Response *)&__range1);
    req.authorization_count_._0_4_ = 1;
    std::
    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&dummy_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
LAB_0019a5e3:
  Response::~Response((Response *)&__range1);
  Request::~Request((Request *)&res.is_chunked_content_provider_);
LAB_0019a617:
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool
Server::process_request(Stream &strm, bool close_connection,
                        bool &connection_closed,
                        const std::function<void(Request &)> &setup_request) {
  std::array<char, 2048> buf{};

  detail::stream_line_reader line_reader(strm, buf.data(), buf.size());

  // Connection has been closed on client
  if (!line_reader.getline()) { return false; }

  Request req;
  Response res;

  res.version = "HTTP/1.1";

  for (const auto &header : default_headers_) {
    if (res.headers.find(header.first) == res.headers.end()) {
      res.headers.insert(header);
    }
  }

#ifdef _WIN32
  // TODO: Increase FD_SETSIZE statically (libzmq), dynamically (MySQL).
#else
#ifndef CPPHTTPLIB_USE_POLL
  // Socket file descriptor exceeded FD_SETSIZE...
  if (strm.socket() >= FD_SETSIZE) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 500;
    return write_response(strm, close_connection, req, res);
  }
#endif
#endif

  // Check if the request URI doesn't exceed the limit
  if (line_reader.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
    Headers dummy;
    detail::read_headers(strm, dummy);
    res.status = 414;
    return write_response(strm, close_connection, req, res);
  }

  // Request line and headers
  if (!parse_request_line(line_reader.ptr(), req) ||
      !detail::read_headers(strm, req.headers)) {
    res.status = 400;
    return write_response(strm, close_connection, req, res);
  }

  if (req.get_header_value("Connection") == "close") {
    connection_closed = true;
  }

  if (req.version == "HTTP/1.0" &&
      req.get_header_value("Connection") != "Keep-Alive") {
    connection_closed = true;
  }

  strm.get_remote_ip_and_port(req.remote_addr, req.remote_port);
  req.set_header("REMOTE_ADDR", req.remote_addr);
  req.set_header("REMOTE_PORT", std::to_string(req.remote_port));

  if (req.has_header("Range")) {
    const auto &range_header_value = req.get_header_value("Range");
    if (!detail::parse_range_header(range_header_value, req.ranges)) {
      res.status = 416;
      return write_response(strm, close_connection, req, res);
    }
  }

  if (setup_request) { setup_request(req); }

  if (req.get_header_value("Expect") == "100-continue") {
    auto status = 100;
    if (expect_100_continue_handler_) {
      status = expect_100_continue_handler_(req, res);
    }
    switch (status) {
    case 100:
    case 417:
      strm.write_format("HTTP/1.1 %d %s\r\n\r\n", status,
                        detail::status_message(status));
      break;
    default: return write_response(strm, close_connection, req, res);
    }
  }

  // Rounting
  bool routed = false;
#ifdef CPPHTTPLIB_NO_EXCEPTIONS
  routed = routing(req, res, strm);
#else
  try {
    routed = routing(req, res, strm);
  } catch (std::exception &e) {
    if (exception_handler_) {
      exception_handler_(req, res, e);
      routed = true;
    } else {
      res.status = 500;
      res.set_header("EXCEPTION_WHAT", e.what());
    }
  } catch (...) {
    res.status = 500;
    res.set_header("EXCEPTION_WHAT", "UNKNOWN");
  }
#endif

  if (routed) {
    if (res.status == -1) { res.status = req.ranges.empty() ? 200 : 206; }
    return write_response_with_content(strm, close_connection, req, res);
  } else {
    if (res.status == -1) { res.status = 404; }
    return write_response(strm, close_connection, req, res);
  }
}